

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmers.h
# Opt level: O1

void __thiscall Kmers<DNA>::ForEach(Kmers<DNA> *this,Callback *block)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  size_type sVar4;
  size_type sVar5;
  bool bVar6;
  byte bVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  pointer pcVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  unsigned_long local_40;
  uint local_34;
  
  sVar3 = this->mLength;
  pcVar12 = (this->mRef->sequence)._M_dataplus._M_p;
  sVar15 = 0xffffffffffffffff;
  if (sVar3 == 0) {
    uVar11 = 0;
  }
  else {
    bVar7 = 0;
    uVar11 = 0;
    sVar8 = 0;
    do {
      bVar2 = pcVar12[sVar8];
      if (bVar2 < 0x54) {
        if (bVar2 == 0x41) {
          bVar6 = false;
          iVar10 = 0;
        }
        else {
          if (bVar2 == 0x43) {
            iVar10 = 1;
          }
          else {
            if (bVar2 != 0x47) goto LAB_0014ad5a;
            iVar10 = 3;
          }
LAB_0014ad34:
          bVar6 = false;
        }
      }
      else {
        if (bVar2 - 0x54 < 2) {
          iVar10 = 2;
          goto LAB_0014ad34;
        }
LAB_0014ad5a:
        iVar10 = -1;
        bVar6 = true;
      }
      uVar9 = iVar10 << (bVar7 & 0x1e);
      if (bVar6) {
        uVar9 = 0;
        sVar15 = sVar8;
      }
      uVar11 = uVar11 | uVar9;
      sVar8 = sVar8 + 1;
      bVar7 = bVar7 + 2;
    } while (sVar3 != sVar8);
    pcVar12 = pcVar12 + sVar3;
  }
  local_34 = uVar11;
  if (sVar15 != 0xffffffffffffffff) {
    local_34 = 0xffffffff;
  }
  local_40 = 0;
  if ((block->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*block->_M_invoker)((_Any_data *)block,&local_34,&local_40);
    sVar4 = (this->mRef->sequence)._M_string_length;
    sVar5 = this->mLength;
    if (sVar4 != sVar5) {
      uVar13 = 0;
      do {
        bVar7 = pcVar12[uVar13];
        if (bVar7 < 0x54) {
          if (bVar7 == 0x41) {
            bVar6 = false;
            iVar10 = 0;
          }
          else {
            if (bVar7 == 0x43) {
              iVar10 = 1;
            }
            else {
              if (bVar7 != 0x47) goto LAB_0014ae87;
              iVar10 = 3;
            }
LAB_0014ae0f:
            bVar6 = false;
          }
        }
        else {
          if (bVar7 - 0x54 < 2) {
            iVar10 = 2;
            goto LAB_0014ae0f;
          }
LAB_0014ae87:
          iVar10 = -1;
          bVar6 = true;
        }
        uVar11 = uVar11 >> 2;
        if (bVar6) {
          sVar15 = this->mLength + uVar13;
        }
        else {
          uVar11 = uVar11 | iVar10 << ((char)this->mLength * '\x02' + 0x1eU & 0x1f);
        }
        uVar1 = uVar13 + 1;
        local_34 = uVar11;
        if (sVar15 != 0xffffffffffffffff && uVar1 <= sVar15) {
          local_34 = 0xffffffff;
        }
        local_40 = uVar1;
        if ((block->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0014ae90;
        (*block->_M_invoker)((_Any_data *)block,&local_34,&local_40);
        uVar14 = uVar13 + 2;
        uVar13 = uVar1;
      } while (uVar14 <= sVar4 - sVar5);
    }
    return;
  }
LAB_0014ae90:
  std::__throw_bad_function_call();
}

Assistant:

void ForEach( const Callback& block ) const {
    const char* ptr = mRef.sequence.data();

    auto bitIndex = []( const size_t pos ) {
      return ( pos * BitMapPolicy< Alphabet >::NumBits ) % ( sizeof( Kmer ) * 8 );
    };

    auto bitMapNucleotide = []( const char base ) {
      return BitMapPolicy< Alphabet >::BitMap( base );
    };

    // First kmer
    size_t lastAmbigIndex = ( size_t ) -1;
    Kmer   kmer           = 0;
    for( size_t k = 0; k < mLength; k++ ) {
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = k;
      } else {
        kmer |= ( val << bitIndex( k ) );
      }
      ptr++;
    }

    if( lastAmbigIndex == ( size_t ) -1 ) {
      block( kmer, 0 );
    } else {
      block( AmbiguousKmer, 0 );
    }

    // For each consecutive kmer, shift window by one
    size_t maxFrame = mRef.Length() - mLength;
    for( size_t frame = 1; frame <= maxFrame; frame++, ptr++ ) {
      kmer >>= BitMapPolicy< Alphabet >::NumBits;
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = frame + mLength - 1;
      } else {
        kmer |= ( val << bitIndex( mLength - 1 ) );
      }

      if( lastAmbigIndex == ( size_t ) -1 || frame > lastAmbigIndex ) {
        block( kmer, frame );
      } else {
        block( AmbiguousKmer, frame );
      }
    }
  }